

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool __thiscall tinyusdz::value::TimeSamples::get_sample_at(TimeSamples *this,double t,Sample **dst)

{
  Sample *pSVar1;
  bool bVar2;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  _Var3;
  long lVar4;
  long lVar5;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  __it;
  double *local_40;
  double t_local;
  
  if (dst == (Sample **)0x0) {
    return false;
  }
  t_local = t;
  if (this->_dirty == true) {
    update(this);
  }
  __it._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = &t_local;
  lVar4 = (long)pSVar1 - (long)__it._M_current;
  for (lVar5 = lVar4 / 0x28 >> 2; _Var3._M_current = __it._M_current, 0 < lVar5; lVar5 = lVar5 + -1)
  {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
            ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                          *)&local_40,__it);
    if (bVar2) goto LAB_0022fbf6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
            ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0022fbf6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
            ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0022fbf6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
            ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0022fbf6;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0xa0;
  }
  lVar4 = lVar4 / 0x28;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      if (lVar4 != 3) {
        return false;
      }
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
              ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                            *)&local_40,__it);
      if (bVar2) goto LAB_0022fbf6;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
            ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                          *)&local_40,_Var3);
    if (bVar2) goto LAB_0022fbf6;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::$_0>
          ::operator()((_Iter_pred<tinyusdz::value::TimeSamples::get_sample_at(double,tinyusdz::value::TimeSamples::Sample**)::__0>
                        *)&local_40,__it);
  _Var3._M_current = __it._M_current;
  if (!bVar2) {
    _Var3._M_current = pSVar1;
  }
LAB_0022fbf6:
  if (_Var3._M_current != pSVar1) {
    *dst = _Var3._M_current;
  }
  return false;
}

Assistant:

bool TimeSamples::get_sample_at(const double t, Sample **dst) {
  if (!dst) {
    return false;
  }

  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &sample) {
    return math::is_close(t, sample.t);
  });

  if (it != _samples.end()) {
    (*dst) = &(*it); 
  }
  return false;
}